

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.cpp
# Opt level: O0

void __thiscall CDataFileReader::GetType(CDataFileReader *this,int Type,int *pStart,int *pNum)

{
  int i;
  int *pNum_local;
  int *pStart_local;
  int Type_local;
  CDataFileReader *this_local;
  
  *pStart = 0;
  *pNum = 0;
  if (this->m_pDataFile != (CDatafile *)0x0) {
    for (i = 0; i < (this->m_pDataFile->m_Header).m_NumItemTypes; i = i + 1) {
      if ((this->m_pDataFile->m_Info).m_pItemTypes[i].m_Type == Type) {
        *pStart = (this->m_pDataFile->m_Info).m_pItemTypes[i].m_Start;
        *pNum = (this->m_pDataFile->m_Info).m_pItemTypes[i].m_Num;
        return;
      }
    }
  }
  return;
}

Assistant:

void CDataFileReader::GetType(int Type, int *pStart, int *pNum)
{
	*pStart = 0;
	*pNum = 0;

	if(!m_pDataFile)
		return;

	for(int i = 0; i < m_pDataFile->m_Header.m_NumItemTypes; i++)
	{
		if(m_pDataFile->m_Info.m_pItemTypes[i].m_Type == Type)
		{
			*pStart = m_pDataFile->m_Info.m_pItemTypes[i].m_Start;
			*pNum = m_pDataFile->m_Info.m_pItemTypes[i].m_Num;
			return;
		}
	}
}